

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowLastValueExecutor::EvaluateInternal
          (WindowLastValueExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExcludeMode WVar1;
  WindowExecutor *pWVar2;
  ulong uVar3;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> _Var4;
  FrameBounds *frame;
  const_reference pvVar5;
  reference pvVar6;
  ulong uVar7;
  WindowCursor *pWVar8;
  pointer pWVar9;
  idx_t row_idx_00;
  WindowExecutorLocalState *pWVar10;
  long lVar11;
  ulong uVar12;
  size_type sVar13;
  ulong uVar14;
  idx_t target_offset;
  ValidityMask **this_00;
  pair<unsigned_long,_unsigned_long> pVar15;
  SubFrames *__range3;
  idx_t local_90;
  WindowExecutorLocalState *local_88;
  WindowExecutorLocalState *local_80;
  ulong local_78;
  type local_70;
  ValidityMask **local_68;
  data_ptr_t local_60;
  WindowExecutor *local_58;
  data_ptr_t local_50;
  data_ptr_t local_48;
  data_ptr_t local_40;
  idx_t local_38;
  
  local_70 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
             operator*(&lstate[0x15].range_cursor);
  pWVar10 = lstate + 2;
  local_80 = lstate;
  optional_ptr<duckdb::ValidityMask,_true>::CheckValid
            ((optional_ptr<duckdb::ValidityMask,_true> *)&gstate[2].executor);
  pWVar2 = gstate[2].executor;
  WVar1 = gstate->executor->wexpr->exclude_clause;
  pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar10,6);
  local_40 = pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar10,7);
  local_48 = pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar10,2);
  local_60 = pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar10,3);
  if (count != 0) {
    local_88 = local_80 + 0x14;
    local_50 = pvVar5->data;
    this_00 = &gstate[2].partition_mask;
    target_offset = 0;
    local_68 = this_00;
    local_58 = pWVar2;
    local_38 = count;
    do {
      pWVar10 = local_88;
      uVar12 = *(ulong *)(local_40 + target_offset * 8);
      uVar3 = *(ulong *)(local_48 + target_offset * 8);
      if (WVar1 == NO_OTHER) {
        sVar13 = 0;
      }
      else {
        uVar7 = row_idx;
        if (WVar1 != CURRENT_ROW) {
          uVar7 = *(ulong *)(local_60 + target_offset * 8);
        }
        if (uVar3 <= uVar7) {
          uVar7 = uVar3;
        }
        if (uVar7 <= uVar12) {
          uVar7 = uVar12;
        }
        local_78 = row_idx;
        pvVar6 = vector<duckdb::FrameBounds,_true>::operator[]
                           ((vector<duckdb::FrameBounds,_true> *)local_88,0);
        pvVar6->start = uVar12;
        pvVar6->end = uVar7;
        if (WVar1 == TIES) {
          uVar7 = uVar12;
          if (uVar12 < local_78) {
            uVar7 = local_78;
          }
          if (uVar3 <= uVar7) {
            uVar7 = uVar3;
          }
          uVar14 = local_78 + 1;
          if (uVar3 <= local_78 + 1) {
            uVar14 = uVar3;
          }
          if (uVar14 <= uVar12) {
            uVar14 = uVar12;
          }
          pvVar6 = vector<duckdb::FrameBounds,_true>::operator[]
                             ((vector<duckdb::FrameBounds,_true> *)pWVar10,1);
          pvVar6->start = uVar7;
          pvVar6->end = uVar14;
          sVar13 = 2;
LAB_00cc2658:
          uVar7 = *(ulong *)(local_50 + target_offset * 8);
        }
        else {
          sVar13 = 1;
          if (WVar1 != CURRENT_ROW) goto LAB_00cc2658;
          uVar7 = local_78 + 1;
        }
        if (uVar12 < uVar7) {
          uVar12 = uVar7;
        }
        row_idx = local_78;
        this_00 = local_68;
        if (uVar3 <= uVar12) {
          uVar12 = uVar3;
        }
      }
      pvVar6 = vector<duckdb::FrameBounds,_true>::operator[]
                         ((vector<duckdb::FrameBounds,_true> *)local_88,sVar13);
      pWVar2 = local_58;
      pvVar6->start = uVar12;
      pvVar6->end = uVar3;
      if (*this_00 == (ValidityMask *)0x0) {
        lVar11 = (long)local_80[0x14].range_cursor.
                       super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
                       .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl -
                 (long)local_80[0x14].super_WindowExecutorState._vptr_WindowExecutorState;
        if (lVar11 != 0) {
          sVar13 = lVar11 >> 4;
          do {
            sVar13 = sVar13 - 1;
            pvVar6 = vector<duckdb::FrameBounds,_true>::operator[]
                               ((vector<duckdb::FrameBounds,_true> *)local_88,sVar13);
            if (pvVar6->start < pvVar6->end) {
              local_90 = 1;
              row_idx_00 = WindowBoundariesState::FindPrevStart
                                     ((ValidityMask *)pWVar2,pvVar6->start,pvVar6->end,&local_90);
              if (local_90 == 0) {
                WindowCursor::CopyCell(local_70,0,row_idx_00,result,target_offset);
                goto LAB_00cc27d1;
              }
            }
          } while (sVar13 != 0);
        }
LAB_00cc2788:
        FlatVector::SetNull(result,target_offset,true);
      }
      else {
        pWVar8 = (WindowCursor *)local_80[0x14].super_WindowExecutorState._vptr_WindowExecutorState;
        _Var4._M_head_impl =
             local_80[0x14].range_cursor.
             super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
             .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
        if (pWVar8 == _Var4._M_head_impl) goto LAB_00cc2788;
        lVar11 = 0;
        do {
          lVar11 = *(long *)&(pWVar8->state).current_chunk_state.handles._M_h +
                   (lVar11 - (long)pWVar8->paged);
          pWVar8 = (WindowCursor *)((long)&(pWVar8->state).current_chunk_state.handles + 8);
        } while (pWVar8 != _Var4._M_head_impl);
        if (lVar11 == 0) goto LAB_00cc2788;
        uVar12 = lVar11 - 1;
        pWVar9 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                 ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                               *)this_00);
        pWVar10 = local_88;
        pVar15 = WindowIndexTree::SelectNth(pWVar9,(SubFrames *)local_88,uVar12);
        if (pVar15.second - 1 < uVar12) {
          pWVar9 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                   ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                                 *)this_00);
          pVar15 = WindowIndexTree::SelectNth(pWVar9,(SubFrames *)pWVar10,uVar12 - pVar15.second);
        }
        if (pVar15.second == 0) {
          WindowCursor::CopyCell(local_70,0,pVar15.first,result,target_offset);
        }
        else {
          FlatVector::SetNull(result,target_offset,true);
        }
      }
LAB_00cc27d1:
      target_offset = target_offset + 1;
      row_idx = row_idx + 1;
    } while (target_offset != local_38);
  }
  return;
}

Assistant:

void WindowLastValueExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                               DataChunk &eval_chunk, Vector &result, idx_t count,
                                               idx_t row_idx) const {
	auto &gvstate = gstate.Cast<WindowValueGlobalState>();
	auto &lvstate = lstate.Cast<WindowValueLocalState>();
	auto &cursor = *lvstate.cursor;
	auto &bounds = lvstate.bounds;
	auto &frames = lvstate.frames;
	auto &ignore_nulls = *gvstate.ignore_nulls;
	auto exclude_mode = gvstate.executor.wexpr.exclude_clause;
	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t i) {
		if (gvstate.value_tree) {
			idx_t frame_width = 0;
			for (const auto &frame : frames) {
				frame_width += frame.end - frame.start;
			}

			if (frame_width) {
				auto n = frame_width - 1;
				auto last_idx = gvstate.value_tree->SelectNth(frames, n);
				if (last_idx.second && last_idx.second <= n) {
					//	Frame larger than data. Since we want last, we back off by the overflow
					n -= last_idx.second;
					last_idx = gvstate.value_tree->SelectNth(frames, n);
				}
				if (last_idx.second) {
					//	No last value - give up.
					FlatVector::SetNull(result, i, true);
				} else {
					cursor.CopyCell(0, last_idx.first, result, i);
				}
			} else {
				FlatVector::SetNull(result, i, true);
			}
			return;
		}

		for (idx_t f = frames.size(); f-- > 0;) {
			const auto &frame = frames[f];
			if (frame.start >= frame.end) {
				continue;
			}

			idx_t n = 1;
			const auto last_idx = WindowBoundariesState::FindPrevStart(ignore_nulls, frame.start, frame.end, n);
			if (!n) {
				cursor.CopyCell(0, last_idx, result, i);
				return;
			}
		}

		// Didn't find one
		FlatVector::SetNull(result, i, true);
	});
}